

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O0

ARKodeButcherTable ARKodeButcherTable_Alloc(int stages,int embedded)

{
  sunrealtype **ppsVar1;
  sunrealtype *psVar2;
  int in_ESI;
  int in_EDI;
  ARKodeButcherTable B;
  int i;
  int local_14;
  ARKodeButcherTable local_8;
  
  if (in_EDI < 1) {
    local_8 = (ARKodeButcherTable)0x0;
  }
  else {
    local_8 = (ARKodeButcherTable)malloc(0x30);
    if (local_8 == (ARKodeButcherTable)0x0) {
      local_8 = (ARKodeButcherTable)0x0;
    }
    else {
      local_8->A = (sunrealtype **)0x0;
      local_8->b = (sunrealtype *)0x0;
      local_8->c = (sunrealtype *)0x0;
      local_8->d = (sunrealtype *)0x0;
      local_8->stages = in_EDI;
      ppsVar1 = (sunrealtype **)calloc((long)in_EDI,8);
      local_8->A = ppsVar1;
      if (local_8->A == (sunrealtype **)0x0) {
        ARKodeButcherTable_Free(local_8);
        local_8 = (ARKodeButcherTable)0x0;
      }
      else {
        for (local_14 = 0; local_14 < in_EDI; local_14 = local_14 + 1) {
          local_8->A[local_14] = (sunrealtype *)0x0;
        }
        for (local_14 = 0; local_14 < in_EDI; local_14 = local_14 + 1) {
          psVar2 = (sunrealtype *)calloc((long)in_EDI,8);
          local_8->A[local_14] = psVar2;
          if (local_8->A[local_14] == (sunrealtype *)0x0) {
            ARKodeButcherTable_Free(local_8);
            return (ARKodeButcherTable)0x0;
          }
        }
        psVar2 = (sunrealtype *)calloc((long)in_EDI,8);
        local_8->b = psVar2;
        if (local_8->b == (sunrealtype *)0x0) {
          ARKodeButcherTable_Free(local_8);
          local_8 = (ARKodeButcherTable)0x0;
        }
        else {
          psVar2 = (sunrealtype *)calloc((long)in_EDI,8);
          local_8->c = psVar2;
          if (local_8->c == (sunrealtype *)0x0) {
            ARKodeButcherTable_Free(local_8);
            local_8 = (ARKodeButcherTable)0x0;
          }
          else {
            if (in_ESI != 0) {
              psVar2 = (sunrealtype *)calloc((long)in_EDI,8);
              local_8->d = psVar2;
              if (local_8->d == (sunrealtype *)0x0) {
                ARKodeButcherTable_Free(local_8);
                return (ARKodeButcherTable)0x0;
              }
            }
            local_8->q = 0;
            local_8->p = 0;
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

ARKodeButcherTable ARKodeButcherTable_Alloc(int stages, sunbooleantype embedded)
{
  int i;
  ARKodeButcherTable B;

  /* Check for legal 'stages' value */
  if (stages < 1) { return (NULL); }

  /* Allocate Butcher table structure */
  B = NULL;
  B = (ARKodeButcherTable)malloc(sizeof(struct ARKodeButcherTableMem));
  if (B == NULL) { return (NULL); }

  /* initialize pointers in B structure to NULL */
  B->A = NULL;
  B->b = NULL;
  B->c = NULL;
  B->d = NULL;

  /* set stages into B structure */
  B->stages = stages;

  /*
   * Allocate fields within Butcher table structure
   */

  /* allocate rows of A */
  B->A = (sunrealtype**)calloc(stages, sizeof(sunrealtype*));
  if (B->A == NULL)
  {
    ARKodeButcherTable_Free(B);
    return (NULL);
  }

  /* initialize each row of A to NULL */
  for (i = 0; i < stages; i++) { B->A[i] = NULL; }

  /* allocate columns of A */
  for (i = 0; i < stages; i++)
  {
    B->A[i] = (sunrealtype*)calloc(stages, sizeof(sunrealtype));
    if (B->A[i] == NULL)
    {
      ARKodeButcherTable_Free(B);
      return (NULL);
    }
  }

  B->b = (sunrealtype*)calloc(stages, sizeof(sunrealtype));
  if (B->b == NULL)
  {
    ARKodeButcherTable_Free(B);
    return (NULL);
  }

  B->c = (sunrealtype*)calloc(stages, sizeof(sunrealtype));
  if (B->c == NULL)
  {
    ARKodeButcherTable_Free(B);
    return (NULL);
  }

  if (embedded)
  {
    B->d = (sunrealtype*)calloc(stages, sizeof(sunrealtype));
    if (B->d == NULL)
    {
      ARKodeButcherTable_Free(B);
      return (NULL);
    }
  }

  /* initialize order parameters */
  B->q = 0;
  B->p = 0;

  return (B);
}